

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_pack16_avx512
               (Mat *kernel,Mat *kernel_tm_pack16,int inch,int outch,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 uVar3;
  void *pvVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int *piVar11;
  undefined1 auVar12 [32];
  long lVar13;
  long lVar14;
  _func_int ***ppp_Var15;
  int iVar16;
  long lVar17;
  undefined8 *puVar18;
  ulong uVar19;
  _func_int ***ppp_Var20;
  int iVar21;
  Allocator *pAVar22;
  ulong uVar23;
  _func_int ***ppp_Var24;
  Allocator *pAVar25;
  long lVar26;
  int i;
  long lVar27;
  _func_int ***ppp_Var28;
  Allocator *pAVar29;
  int j;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  float tmp [4] [3];
  Mat local_b8;
  long local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elempack = 0;
  local_b8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elemsize._4_4_ = (int)local_b8.refcount;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.c = local_b8.elempack;
  Mat::create(&local_b8,0x10,inch,outch,4,(Allocator *)0x0);
  auVar12 = _DAT_00551220;
  if (0 < outch) {
    pvVar4 = kernel->data;
    auVar35 = vpermi2ps_avx512vl(ZEXT1632(_DAT_00551300),_DAT_00550a40,_DAT_00550a60);
    auVar37 = auVar35._0_16_;
    auVar35 = vpermi2ps_avx512vl(ZEXT1632(_DAT_00551310),_DAT_00550a40,_DAT_00550a60);
    auVar36 = vpermi2ps_avx512vl(ZEXT1632(_DAT_00551320),_DAT_00550a40,_DAT_00550a60);
    uVar23 = 0;
    pAVar29 = (Allocator *)local_b8.data;
    do {
      if (0 < inch) {
        iVar21 = inch * 9 * (int)uVar23;
        uVar19 = 0;
        pAVar22 = pAVar29;
        do {
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4);
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar32 = vmulps_avx512vl(auVar37,auVar32);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 4);
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar38 = auVar35._0_16_;
          auVar32 = vfmadd231ps_avx512vl(auVar32,auVar38,auVar33);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 8);
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          auVar39 = auVar36._0_16_;
          auVar32 = vfmadd231ps_avx512vl(auVar32,auVar39,auVar34);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 0xc);
          auVar6._4_4_ = uVar1;
          auVar6._0_4_ = uVar1;
          auVar6._8_4_ = uVar1;
          auVar6._12_4_ = uVar1;
          auVar33 = vmulps_avx512vl(auVar37,auVar6);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 0x10);
          auVar7._4_4_ = uVar1;
          auVar7._0_4_ = uVar1;
          auVar7._8_4_ = uVar1;
          auVar7._12_4_ = uVar1;
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar38,auVar7);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 0x14);
          auVar8._4_4_ = uVar1;
          auVar8._0_4_ = uVar1;
          auVar8._8_4_ = uVar1;
          auVar8._12_4_ = uVar1;
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar39,auVar8);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 0x18);
          auVar9._4_4_ = uVar1;
          auVar9._0_4_ = uVar1;
          auVar9._8_4_ = uVar1;
          auVar9._12_4_ = uVar1;
          auVar34 = vmulps_avx512vl(auVar37,auVar9);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 0x1c);
          auVar10._4_4_ = uVar1;
          auVar10._0_4_ = uVar1;
          auVar10._8_4_ = uVar1;
          auVar10._12_4_ = uVar1;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar38,auVar10);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar19 * 0x24 + (long)iVar21 * 4 + 0x20);
          auVar38._4_4_ = uVar1;
          auVar38._0_4_ = uVar1;
          auVar38._8_4_ = uVar1;
          auVar38._12_4_ = uVar1;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar38);
          auVar40._16_16_ = auVar33;
          auVar40._0_16_ = auVar32;
          local_68 = vpermt2ps_avx512vl(auVar40,auVar12,ZEXT1632(auVar34));
          auVar33 = vshufps_avx(auVar32,auVar33,0xff);
          auVar32 = vshufpd_avx(auVar34,auVar34,3);
          local_48 = vblendps_avx(auVar32,auVar33,6);
          lVar30 = 0;
          pAVar25 = pAVar22;
          do {
            uVar2 = *(uint *)(local_68 + lVar30 * 0xc);
            uVar3 = *(undefined8 *)(local_68 + lVar30 * 0xc + 4);
            puVar18 = &DAT_00550a44;
            lVar27 = 0;
            do {
              auVar39._0_4_ = (float)*puVar18 * (float)uVar3;
              auVar39._4_4_ = (float)((ulong)*puVar18 >> 0x20) * (float)((ulong)uVar3 >> 0x20);
              auVar39._8_8_ = 0;
              auVar33 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar18 + -4)),auVar39,
                                        ZEXT416(uVar2));
              auVar32 = vmovshdup_avx(auVar39);
              *(float *)((long)&pAVar25->_vptr_Allocator + lVar27 * 4) =
                   auVar33._0_4_ + auVar32._0_4_;
              lVar27 = lVar27 + 1;
              puVar18 = (undefined8 *)((long)puVar18 + 0xc);
            } while (lVar27 != 4);
            lVar30 = lVar30 + 1;
            pAVar25 = pAVar25 + 2;
          } while (lVar30 != 4);
          uVar19 = uVar19 + 1;
          pAVar22 = (Allocator *)
                    ((long)&pAVar22->_vptr_Allocator +
                    (long)local_b8.w *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        } while (uVar19 != (uint)inch);
      }
      uVar23 = uVar23 + 1;
      pAVar29 = (Allocator *)
                ((long)&pAVar29->_vptr_Allocator +
                local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
    } while (uVar23 != (uint)outch);
  }
  iVar21 = inch + 0xf;
  if (-1 < inch) {
    iVar21 = inch;
  }
  iVar16 = outch + 0xf;
  if (-1 < outch) {
    iVar16 = outch;
  }
  Mat::create(kernel_tm_pack16,iVar21 >> 4,0x10,iVar16 >> 4,0x400,0x100,(Allocator *)0x0);
  if (0xf < outch) {
    iVar21 = kernel_tm_pack16->w;
    pvVar4 = kernel_tm_pack16->data;
    sVar5 = kernel_tm_pack16->elemsize;
    local_70 = kernel_tm_pack16->cstep * sVar5;
    uVar23 = 0;
    do {
      lVar27 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      ppp_Var28 = (_func_int ***)((long)(_func_int ***)local_b8.data + lVar27 * uVar23);
      lVar30 = (long)local_b8.w * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      lVar31 = 0;
      do {
        if (0xf < inch) {
          lVar13 = (long)pvVar4 + (long)iVar21 * sVar5 * lVar31 + (uVar23 >> 4) * local_70;
          ppp_Var24 = ppp_Var28;
          lVar26 = 0;
          do {
            lVar17 = 0;
            ppp_Var20 = ppp_Var24;
            do {
              lVar14 = lVar13;
              lVar13 = 0;
              ppp_Var15 = ppp_Var20;
              do {
                *(undefined4 *)(lVar14 + lVar13) = *(undefined4 *)ppp_Var15;
                ppp_Var15 = (_func_int ***)((long)ppp_Var15 + lVar27);
                lVar13 = lVar13 + 4;
              } while (lVar13 != 0x40);
              lVar17 = lVar17 + 1;
              ppp_Var20 = (_func_int ***)((long)ppp_Var20 + lVar30);
              lVar13 = lVar14 + 0x40;
            } while (lVar17 != 0x10);
            lVar17 = lVar26 + 0x1f;
            ppp_Var24 = ppp_Var24 + lVar30 * 2;
            lVar13 = lVar14 + 0x40;
            lVar26 = lVar26 + 0x10;
          } while (lVar17 < inch);
        }
        lVar31 = lVar31 + 1;
        ppp_Var28 = (_func_int ***)((long)ppp_Var28 + 4);
      } while (lVar31 != 0x10);
      uVar19 = uVar23 + 0x1f;
      uVar23 = uVar23 + 0x10;
    } while (uVar19 < (uint)outch);
  }
  piVar11 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_pack16_avx512(const Mat& kernel, Mat& kernel_tm_pack16, int inch, int outch, const Option& opt)
{
    // winograd23 transform kernel
    Mat kernel_tm(4 * 4, inch, outch);

    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 16-inch-outch
    // dst = pb-pa-inch/pa-16-outch/pb
    kernel_tm_pack16.create(inch / 16, 16, outch / 16, (size_t)4u * 16 * 16, 16 * 16);
    for (int q = 0; q + 15 < outch; q += 16)
    {
        Mat g0 = kernel_tm_pack16.channel(q / 16);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 15 < inch; p += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}